

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void_t<typename_unique_ptr<unique_ptr<int>_>::element_type>
mserialize::detail::
BuiltinDeserializer<std::unique_ptr<std::unique_ptr<int,std::default_delete<int>>,std::default_delete<std::unique_ptr<int,std::default_delete<int>>>>,void>
::
make_nonempty<std::unique_ptr<std::unique_ptr<int,std::default_delete<int>>,std::default_delete<std::unique_ptr<int,std::default_delete<int>>>>>
          (unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *ptr)

{
  unique_ptr<int,_std::default_delete<int>_> *this;
  pointer in_RDI;
  
  this = (unique_ptr<int,_std::default_delete<int>_> *)operator_new(8);
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>(this);
  std::
  unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  ::reset((unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *)this,in_RDI);
  return;
}

Assistant:

static void_t<typename SmartPtr::element_type> make_nonempty(SmartPtr& ptr)
  {
    using T = typename SmartPtr::element_type;
    ptr.reset(new T{}); // NOLINT(cppcoreguidelines-owning-memory)
  }